

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_cat.cpp
# Opt level: O1

int main(void)

{
  FILE *__stream;
  FILE *__stream_00;
  uchar uVar1;
  int iVar2;
  int iVar3;
  uchar *data;
  
  data = (uchar *)operator_new__(10000);
  iVar3 = 0;
  memset(data,0,10000);
  __stream_00 = _stdin;
  __stream = _stdout;
  *data = '\t';
  iVar2 = getc(__stream_00);
  uVar1 = (uchar)iVar2;
  data[1] = uVar1;
  if (*data == '\0') {
    if (uVar1 != '\0') {
      data[1] = uVar1 + 9;
      fputc((uint)(byte)(uVar1 + 9),__stream);
      *data = *data + '\t';
      iVar3 = libbrain::
              state<41U,_(libbrain::bfop)2,_(libbrain::bfop)6,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)2,_(libbrain::bfop)5,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)2,_(libbrain::bfop)5,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)8,_(libbrain::bfop)9>
              ::exec(data,0,(FILE *)__stream,(FILE *)__stream_00);
    }
  }
  else {
    *data = *data + 0xff;
    iVar3 = libbrain::
            state<16U,_(libbrain::bfop)1,_(libbrain::bfop)6,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)2,_(libbrain::bfop)5,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)2,_(libbrain::bfop)5,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)8,_(libbrain::bfop)9>
            ::exec(data,1,(FILE *)__stream,(FILE *)__stream_00);
  }
  operator_delete__(data);
  return iVar3;
}

Assistant:

int main() {
    auto* data = BRAIN_ALLOC_TAPE(10000);

    // the cat program: reads from the input until such a time as it reads a 'tab' character
    BRAIN_PROGRAM stdin_cat = BRAIN_COMPILE(+++++++++>,<[->-<]>[+++++++++.<+++++++++>,<[->-<]>]);

    int status_code = stdin_cat.exec(data, 0);

    delete[] data;

    return status_code;
}